

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 挑7.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  long *plVar2;
  long lVar3;
  ostream *this;
  int in_stack_0000001c;
  int i;
  int sum;
  int n;
  string local_30 [32];
  int local_10;
  int local_c;
  int local_8 [2];
  
  local_8[1] = 0;
  while( true ) {
    plVar2 = (long *)std::istream::operator>>((istream *)&std::cin,local_8);
    bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar2 + *(long *)(*plVar2 + -0x18)));
    if (!bVar1) break;
    local_c = 0;
    for (local_10 = 6; local_10 < local_8[0] + 1; local_10 = local_10 + 1) {
      bVar1 = true;
      if (local_10 % 7 != 0) {
        std::__cxx11::to_string(in_stack_0000001c);
        lVar3 = std::__cxx11::string::find((char)local_30,0x37);
        bVar1 = lVar3 != -1;
        std::__cxx11::string::~string(local_30);
      }
      if (bVar1) {
        local_c = local_c + 1;
      }
    }
    this = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_c);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  return 0;
}

Assistant:

int main()
{
    int n;
    while(cin>>n)
    {
        int sum(0);
        for (int i=6;i<n+1;i++)
        {
            if(i%7 == 0 || to_string(i).find('7') != -1)
                sum++;
        }

        cout<<sum<<endl;
        //cout<<stoi("23454")<<endl;
        //stox,以及to_string两个函数都是std中的成员，不需要其他头文件引用
    }
    return 0;
}